

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  ushort *puVar1;
  byte bVar2;
  short sVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int cx;
  int cy;
  ushort uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int num_vertices;
  int iVar15;
  stbtt_vertex *psVar16;
  ulong uVar17;
  ushort *puVar18;
  stbtt_vertex *psVar19;
  ulong uVar20;
  short sVar21;
  int was_off;
  stbtt_int32 cx_00;
  stbtt_int32 sVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  byte bVar26;
  short sVar27;
  int sx;
  byte bVar28;
  int sy;
  ushort uVar29;
  stbtt_int32 cy_00;
  stbtt_int32 sVar30;
  ulong uVar31;
  int iVar32;
  uint start_off;
  ushort *puVar33;
  float fVar34;
  float fVar35;
  float fVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  ulong local_128;
  stbtt__csctx count_ctx;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  if ((info->cff).size != 0) {
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx._4_12_ = SUB1612((undefined1  [16])0x0,4);
    count_ctx.bounds = 1;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    iVar12 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar12 != 0) {
      iVar12 = count_ctx.num_vertices;
      psVar16 = (stbtt_vertex *)ImGui::MemAlloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = psVar16;
      local_48._8_8_ = psVar16;
      iVar13 = stbtt__run_charstring(info,glyph_index,(stbtt__csctx *)local_68);
      if (iVar13 != 0) {
        if ((int)local_38 == iVar12) {
          return (int)local_38;
        }
        __assert_fail("output_ctx.num_vertices == count_ctx.num_vertices",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                      ,0x8c6,
                      "int stbtt__GetGlyphShapeT2(const stbtt_fontinfo *, int, stbtt_vertex **)");
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
    return 0;
  }
  puVar4 = info->data;
  uVar14 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  if ((int)uVar14 < 0) {
LAB_0015bd3b:
    local_128._0_4_ = 0;
  }
  else {
    uVar17 = (ulong)uVar14;
    uVar11 = CONCAT11(puVar4[uVar17],puVar4[uVar17 + 1]);
    if ((short)uVar11 < 1) {
      if (uVar11 == 0xffff) {
        local_128 = 0;
        psVar16 = (stbtt_vertex *)0x0;
        puVar18 = (ushort *)(puVar4 + uVar17 + 10);
        bVar26 = 1;
        do {
          bVar28 = bVar26;
          if (bVar28 == 0) break;
          auVar37._8_8_ = 0;
          auVar37._0_4_ = count_ctx.first_x;
          auVar37._4_4_ = count_ctx.first_y;
          count_ctx._0_16_ = auVar37 << 0x40;
          bVar26 = *(byte *)((long)puVar18 + 1);
          if ((bVar26 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                          ,0x70b,
                          "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)"
                         );
          }
          if ((bVar26 & 1) == 0) {
            iVar12 = (int)(char)puVar18[2];
            iVar13 = (int)((long)((ulong)*(byte *)((long)puVar18 + 5) << 0x38) >> 0x38);
            lVar24 = 6;
          }
          else {
            auVar8._9_7_ = 0;
            auVar8._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
            auVar7._10_6_ = 0;
            auVar7._0_10_ = SUB1610(auVar8 << 0x38,6);
            auVar6._11_5_ = 0;
            auVar6._0_11_ = SUB1611(auVar7 << 0x30,5);
            auVar9._1_12_ = SUB1612(auVar6 << 0x28,4);
            auVar9[0] = (char)puVar18[3];
            auVar9._13_3_ = 0;
            auVar5._1_14_ = SUB1614(auVar9 << 0x18,2);
            auVar5[0] = (char)puVar18[2];
            auVar5[0xf] = 0;
            auVar37 = ZEXT416((uint)*(byte *)((long)puVar18 + 7) << 0x10 |
                              (uint)*(byte *)((long)puVar18 + 5)) | auVar5 << 8;
            iVar12 = (int)auVar37._0_2_;
            iVar13 = (int)auVar37._2_2_;
            lVar24 = 8;
          }
          puVar33 = (ushort *)(lVar24 + (long)puVar18);
          if ((bVar26 & 8) == 0) {
            if ((bVar26 & 0x40) != 0) {
              puVar1 = puVar33 + 1;
              fVar41 = (float)(int)(short)(*puVar33 << 8 | *puVar33 >> 8) * 6.1035156e-05;
              puVar33 = puVar33 + 2;
              fVar44 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
              goto LAB_0015ba60;
            }
            if ((char)bVar26 < '\0') {
              fVar41 = (float)(int)CONCAT11((char)*puVar33,*(undefined1 *)((long)puVar33 + 1)) *
                       6.1035156e-05;
              fVar42 = (float)(int)((long)((ulong)CONCAT11((char)puVar33[1],
                                                           *(undefined1 *)((long)puVar33 + 3)) <<
                                          0x30) >> 0x30) * 6.1035156e-05;
              fVar43 = (float)(int)CONCAT11((char)puVar33[2],*(undefined1 *)((long)puVar33 + 5)) *
                       6.1035156e-05;
              fVar44 = (float)(int)((long)((ulong)CONCAT11((char)puVar33[3],
                                                           *(undefined1 *)((long)puVar33 + 7)) <<
                                          0x30) >> 0x30) * 6.1035156e-05;
              puVar33 = puVar33 + 4;
            }
            else {
              fVar41 = 1.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 1.0;
            }
          }
          else {
            fVar41 = (float)(int)(short)(*puVar33 << 8 | *puVar33 >> 8) * 6.1035156e-05;
            puVar33 = puVar33 + 1;
            fVar44 = fVar41;
LAB_0015ba60:
            fVar42 = 0.0;
            fVar43 = 0.0;
          }
          uVar11 = puVar18[1];
          fVar34 = fVar41 * fVar41 + fVar42 * fVar42;
          if (fVar34 < 0.0) {
            fVar34 = sqrtf(fVar34);
          }
          else {
            fVar34 = SQRT(fVar34);
          }
          fVar35 = fVar43 * fVar43 + fVar44 * fVar44;
          if (fVar35 < 0.0) {
            fVar35 = sqrtf(fVar35);
          }
          else {
            fVar35 = SQRT(fVar35);
          }
          uVar14 = stbtt_GetGlyphShape(info,(uint)(ushort)(uVar11 << 8 | uVar11 >> 8),
                                       (stbtt_vertex **)&count_ctx);
          if ((int)uVar14 < 1) {
LAB_0015bc4b:
            bVar10 = true;
            bVar26 = bVar26 & 0x20;
          }
          else {
            lVar24 = 0;
            do {
              fVar38 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + lVar24) << 0x30)
                                   >> 0x30);
              fVar39 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + lVar24);
              fVar40 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + lVar24) << 0x30)
                                   >> 0x30);
              auVar36._0_4_ =
                   (int)((fVar39 * fVar43 +
                          (float)(int)*(short *)(count_ctx._0_8_ + lVar24) * fVar41 + (float)iVar12)
                        * fVar34);
              auVar36._4_4_ =
                   (int)((fVar39 * fVar44 +
                          (float)(int)*(short *)(count_ctx._0_8_ + lVar24) * fVar42 + (float)iVar13)
                        * fVar35);
              auVar36._8_4_ = (int)((fVar40 * fVar43 + fVar38 * fVar41 + (float)iVar12) * fVar34);
              auVar36._12_4_ = (int)((fVar40 * fVar44 + fVar38 * fVar42 + (float)iVar13) * fVar35);
              auVar37 = packssdw(auVar36,auVar36);
              *(long *)(count_ctx._0_8_ + lVar24) = auVar37._0_8_;
              lVar24 = lVar24 + 0xe;
            } while ((ulong)uVar14 * 0xe != lVar24);
            psVar19 = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar14 + (int)local_128) * 0xe);
            if (psVar19 != (stbtt_vertex *)0x0) {
              if (0 < (int)local_128) {
                memcpy(psVar19,psVar16,local_128 * 0xe);
              }
              memcpy(psVar19 + local_128,(void *)count_ctx._0_8_,(ulong)uVar14 * 0xe);
              if (psVar16 != (stbtt_vertex *)0x0) {
                ImGui::MemFree(psVar16);
              }
              ImGui::MemFree((void *)count_ctx._0_8_);
              local_128 = (ulong)(uVar14 + (int)local_128);
              psVar16 = psVar19;
              goto LAB_0015bc4b;
            }
            if (psVar16 != (stbtt_vertex *)0x0) {
              ImGui::MemFree(psVar16);
            }
            if (count_ctx._0_8_ != 0) {
              ImGui::MemFree((void *)count_ctx._0_8_);
            }
            bVar10 = false;
            bVar26 = bVar28;
          }
          puVar18 = puVar33;
        } while (bVar10);
        if (bVar28 != 0) goto LAB_0015bd3b;
      }
      else {
        if ((short)((ushort)puVar4[uVar17] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                        ,0x740,
                        "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        local_128._0_4_ = 0;
        psVar16 = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar14 = (uint)uVar11 * 2;
      uVar31 = (ulong)uVar14;
      bVar26 = puVar4[uVar31 + uVar17 + 10];
      bVar28 = puVar4[uVar31 + uVar17 + 0xb];
      iVar12 = (uint)puVar4[uVar31 + uVar17 + 8] * 0x100;
      bVar2 = puVar4[uVar31 + uVar17 + 9];
      psVar16 = (stbtt_vertex *)
                ImGui::MemAlloc((ulong)((iVar12 + (uint)bVar2 + (uint)uVar11 * 2) * 0xe + 0xe));
      local_128._0_4_ = 0;
      if (psVar16 != (stbtt_vertex *)0x0) {
        puVar18 = (ushort *)(puVar4 + (ulong)bVar26 * 0x100 + (ulong)bVar28 + uVar31 + uVar17 + 0xc)
        ;
        uVar20 = (ulong)(iVar12 + (uint)bVar2);
        lVar24 = 0;
        bVar26 = 0;
        bVar28 = 0;
        do {
          if (bVar28 == 0) {
            bVar26 = (byte)*puVar18;
            if ((bVar26 & 8) == 0) {
              puVar18 = (ushort *)((long)puVar18 + 1);
            }
            else {
              bVar28 = *(byte *)((long)puVar18 + 1);
              puVar18 = puVar18 + 1;
            }
          }
          else {
            bVar28 = bVar28 - 1;
          }
          *(byte *)((long)psVar16 + lVar24 + (ulong)uVar11 * 0x20 + uVar31 * -2 + 0xc) = bVar26;
          lVar24 = lVar24 + 0xe;
        } while ((ulong)((iVar12 + (uint)bVar2 + 1) * 0x10) - (uVar20 * 2 + 2) != lVar24);
        lVar24 = (ulong)(uint)((int)(uVar31 & 0xffff) << 4) + (uVar31 & 0xffff) * -2;
        lVar25 = 0;
        sVar27 = 0;
        do {
          bVar26 = *(byte *)((long)psVar16 + lVar25 + lVar24 + 0xc);
          if ((bVar26 & 2) == 0) {
            if ((bVar26 & 0x10) == 0) {
              sVar27 = sVar27 + (*puVar18 << 8 | *puVar18 >> 8);
              puVar18 = puVar18 + 1;
            }
          }
          else {
            uVar11 = *puVar18;
            puVar18 = (ushort *)((long)puVar18 + 1);
            uVar29 = -(ushort)(byte)uVar11;
            if ((bVar26 & 0x10) != 0) {
              uVar29 = (ushort)(byte)uVar11;
            }
            sVar27 = sVar27 + uVar29;
          }
          *(short *)((long)psVar16 + lVar25 + lVar24) = sVar27;
          lVar25 = lVar25 + 0xe;
        } while ((ulong)((iVar12 + (uint)bVar2 + 1) * 0x10) - (uVar20 * 2 + 2) != lVar25);
        lVar25 = (ulong)((uVar14 & 0xffff) << 4) + (ulong)(uVar14 & 0xffff) * -2;
        lVar24 = 0;
        sVar27 = 0;
        do {
          bVar26 = *(byte *)((long)psVar16 + lVar24 + lVar25 + 0xc);
          if ((bVar26 & 4) == 0) {
            if ((bVar26 & 0x20) == 0) {
              sVar27 = sVar27 + (*puVar18 << 8 | *puVar18 >> 8);
              puVar18 = puVar18 + 1;
            }
          }
          else {
            uVar11 = *puVar18;
            puVar18 = (ushort *)((long)puVar18 + 1);
            uVar29 = -(ushort)(byte)uVar11;
            if ((bVar26 & 0x20) != 0) {
              uVar29 = (ushort)(byte)uVar11;
            }
            sVar27 = sVar27 + uVar29;
          }
          *(short *)((long)psVar16 + lVar24 + lVar25 + 2) = sVar27;
          lVar24 = lVar24 + 0xe;
        } while ((ulong)((iVar12 + (uint)bVar2 + 1) * 0x10) - (uVar20 * 2 + 2) != lVar24);
        num_vertices = 0;
        iVar13 = 0;
        iVar32 = 0;
        iVar15 = 0;
        sVar30 = 0;
        sVar22 = 0;
        sy = 0;
        sx = 0;
        start_off = 0;
        was_off = 0;
        cx = 0;
        cy = 0;
        do {
          lVar24 = (long)(int)(uVar14 + iVar13);
          bVar26 = psVar16[lVar24].type;
          sVar27 = psVar16[lVar24].x;
          sVar3 = psVar16[lVar24].y;
          cx_00 = (stbtt_int32)sVar27;
          cy_00 = (stbtt_int32)sVar3;
          if (iVar15 == iVar13) {
            if (iVar13 != 0) {
              num_vertices = stbtt__close_shape(psVar16,num_vertices,was_off,start_off,sx,sy,sVar22,
                                                sVar30,cx,cy);
            }
            sx = cx_00;
            sy = cy_00;
            if ((bVar26 & 1) == 0) {
              sVar22 = cx_00;
              sVar30 = cy_00;
              if ((psVar16[lVar24 + 1].type & 1) == 0) {
                sx = psVar16[lVar24 + 1].x + cx_00 >> 1;
                sy = psVar16[lVar24 + 1].y + cy_00 >> 1;
              }
              else {
                iVar13 = iVar13 + 1;
                sx = (int)psVar16[lVar24 + 1].x;
                sy = (int)psVar16[lVar24 + 1].y;
              }
            }
            start_off = bVar26 & 1 ^ 1;
            psVar16[num_vertices].type = '\x01';
            psVar16[num_vertices].x = (short)sx;
            psVar16[num_vertices].y = (short)sy;
            psVar16[num_vertices].cx = 0;
            psVar16[num_vertices].cy = 0;
            iVar15 = (ushort)(*(ushort *)(puVar4 + (long)iVar32 * 2 + uVar17 + 10) << 8 |
                             *(ushort *)(puVar4 + (long)iVar32 * 2 + uVar17 + 10) >> 8) + 1;
            iVar32 = iVar32 + 1;
            was_off = 0;
            iVar23 = iVar13;
            num_vertices = num_vertices + 1;
            cx_00 = cx;
            cy_00 = cy;
          }
          else {
            sVar21 = (short)cy;
            iVar23 = iVar13;
            if ((bVar26 & 1) == 0) {
              iVar13 = num_vertices;
              if (was_off != 0) {
                iVar13 = num_vertices + 1;
                psVar16[num_vertices].type = '\x03';
                psVar16[num_vertices].x = (short)((uint)(cx + cx_00) >> 1);
                psVar16[num_vertices].y = (short)((uint)(cy + cy_00) >> 1);
                psVar16[num_vertices].cx = (short)cx;
                psVar16[num_vertices].cy = sVar21;
              }
              was_off = 1;
              num_vertices = iVar13;
            }
            else {
              psVar19 = psVar16 + num_vertices;
              if (was_off == 0) {
                psVar19->type = '\x02';
                psVar19->x = sVar27;
                psVar19->y = sVar3;
                psVar19->cx = 0;
                sVar21 = 0;
              }
              else {
                psVar19->type = '\x03';
                psVar19->x = sVar27;
                psVar19->y = sVar3;
                psVar19->cx = (short)cx;
              }
              psVar19->cy = sVar21;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx_00 = cx;
              cy_00 = cy;
            }
          }
          iVar13 = iVar23 + 1;
          cx = cx_00;
          cy = cy_00;
        } while (iVar23 < (int)(iVar12 + (uint)bVar2));
        local_128._0_4_ =
             stbtt__close_shape(psVar16,num_vertices,was_off,start_off,sx,sy,sVar22,sVar30,cx_00,
                                cy_00);
      }
      if (psVar16 == (stbtt_vertex *)0x0) {
        return 0;
      }
    }
    *pvertices = psVar16;
  }
  return (int)local_128;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}